

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::readValue(Reader *this)

{
  size_t len;
  ValueHolder *pVVar1;
  ValueHolder VVar2;
  Location pCVar3;
  _Elt_pointer ppVVar4;
  Location pCVar5;
  bool bVar6;
  _Elt_pointer ppVVar7;
  ushort uVar8;
  _Elt_pointer ppVVar9;
  Value v;
  Token token;
  ValueHolder local_50;
  ushort local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined8 local_30;
  Token local_28;
  
  if (999 < stackDepth_g) {
    local_50.string_ = (char *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Exceeded stackLimit in readValue().","");
    throwRuntimeError((string *)&local_50);
  }
  stackDepth_g = stackDepth_g + 1;
  skipCommentTokens(this,&local_28);
  if ((this->collectComments_ == true) && (len = (this->commentsBefore_)._M_string_length, len != 0)
     ) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setComment(ppVVar7[-1],(this->commentsBefore_)._M_dataplus._M_p,len,commentBefore);
    std::__cxx11::string::_M_replace
              ((ulong)&this->commentsBefore_,0,(char *)(this->commentsBefore_)._M_string_length,
               0x122aed);
  }
  switch(local_28.type_) {
  case tokenObjectBegin:
    bVar6 = readObject(this,&local_28);
    break;
  case tokenObjectEnd:
  case tokenArrayEnd:
  case tokenArraySeparator:
    if ((this->features_).allowDroppedNullPlaceholders_ != true) goto switchD_0010b74c_default;
    this->current_ = this->current_ + -1;
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar1 = &ppVVar7[-1]->value_;
    uVar8 = *(ushort *)(pVVar1 + 1);
    *(ushort *)(pVVar1 + 1) = uVar8 & 0xff00;
    VVar2.uint_ = *(LargestUInt *)pVVar1;
    pVVar1->uint_ = (LargestUInt)local_50;
    *(ushort *)(pVVar1 + 1) = uVar8 & 0xfe00;
    local_48 = uVar8 & 0x100 | local_48 & 0xfe00 | uVar8 & 0xff;
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar9 = ppVVar7;
    if (ppVVar7 == ppVVar4) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar5 = this->begin_;
    pCVar3 = this->current_;
    ppVVar9[-1]->start_ = (ptrdiff_t)(pCVar3 + ~(ulong)pCVar5);
    if (ppVVar7 == ppVVar4) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar7[-1]->limit_ = (long)pCVar3 - (long)pCVar5;
    local_50.uint_ = VVar2.uint_;
    goto LAB_0010bad5;
  case tokenArrayBegin:
    bVar6 = readArray(this,&local_28);
    break;
  case tokenString:
    bVar6 = decodeString(this,&local_28);
    goto LAB_0010bae1;
  case tokenNumber:
    bVar6 = decodeNumber(this,&local_28);
    goto LAB_0010bae1;
  case tokenTrue:
    local_50.bool_ = true;
    goto LAB_0010ba20;
  case tokenFalse:
    local_50.uint_ = (ulong)(uint7)local_50.uint_._1_7_ << 8;
LAB_0010ba20:
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar1 = &ppVVar7[-1]->value_;
    uVar8 = *(ushort *)(pVVar1 + 1);
    *(ushort *)(pVVar1 + 1) = uVar8 & 0xff00 | 5;
    local_48 = local_48 & 0xfe00 | uVar8 & 0xff;
    VVar2.uint_ = *(LargestUInt *)pVVar1;
    pVVar1->uint_ = (LargestUInt)local_50;
    *(ushort *)(pVVar1 + 1) = uVar8 & 0xfe00 | 5;
    local_50.uint_ = VVar2.uint_;
LAB_0010ba72:
    local_48 = uVar8 & 0x100 | local_48;
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar9 = ppVVar7;
    if (ppVVar7 == ppVVar4) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar5 = this->begin_;
    ppVVar9[-1]->start_ = (long)local_28.start_ - (long)pCVar5;
    if (ppVVar7 == ppVVar4) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar7[-1]->limit_ = (long)local_28.end_ - (long)pCVar5;
LAB_0010bad5:
    local_30 = 0;
    local_40._8_8_ = 0;
    local_40._M_allocated_capacity = 0;
    Value::~Value((Value *)&local_50);
    bVar6 = true;
    goto LAB_0010bae1;
  case tokenNull:
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar1 = &ppVVar7[-1]->value_;
    uVar8 = *(ushort *)(pVVar1 + 1);
    *(ushort *)(pVVar1 + 1) = uVar8 & 0xff00;
    local_48 = local_48 & 0xfe00 | uVar8 & 0xff;
    VVar2.uint_ = *(LargestUInt *)pVVar1;
    pVVar1->uint_ = (LargestUInt)local_50;
    *(ushort *)(pVVar1 + 1) = uVar8 & 0xfe00;
    local_50.uint_ = VVar2.uint_;
    goto LAB_0010ba72;
  default:
switchD_0010b74c_default:
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar9 = ppVVar7;
    if (ppVVar7 == ppVVar4) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar5 = this->begin_;
    ppVVar9[-1]->start_ = (long)local_28.start_ - (long)pCVar5;
    if (ppVVar7 == ppVVar4) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar7[-1]->limit_ = (long)local_28.end_ - (long)pCVar5;
    local_50.string_ = (char *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Syntax error: value, object or array expected.","");
    addError(this,(string *)&local_50,&local_28,(Location)0x0);
    if (local_50 != &local_40) {
      operator_delete(local_50.string_);
    }
    return false;
  }
  ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar7 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar7[-1]->limit_ = (long)this->current_ - (long)this->begin_;
LAB_0010bae1:
  if (this->collectComments_ == true) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    this->lastValueEnd_ = this->current_;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->lastValue_ = ppVVar7[-1];
  }
  stackDepth_g = stackDepth_g + -1;
  return bVar6;
}

Assistant:

bool Reader::readValue() {
  // This is a non-reentrant way to support a stackLimit. Terrible!
  // But this deprecated class has a security problem: Bad input can
  // cause a seg-fault. This seems like a fair, binary-compatible way
  // to prevent the problem.
  if (stackDepth_g >= stackLimit_g) throwRuntimeError("Exceeded stackLimit in readValue().");
  ++stackDepth_g;

  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_ = "";
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue:
    {
    Value v(true);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenFalse:
    {
    Value v(false);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenNull:
    {
    Value v;
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenArraySeparator:
  case tokenObjectEnd:
  case tokenArrayEnd:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      Value v;
      currentValue().swapPayload(v);
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    } // Else, fall through...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValue_ = &currentValue();
  }

  --stackDepth_g;
  return successful;
}